

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  pointer puVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> info;
  string file_out;
  string file_in;
  string cmd;
  HuffmanArchiver h;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_440;
  ifstream cin;
  byte abStack_408 [488];
  ofstream cout;
  byte abStack_200 [480];
  
  info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 6) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not enough arquments, need 6!");
    std::endl<char,std::char_traits<char>>(poVar3);
    goto LAB_001087a2;
  }
  std::__cxx11::string::string((string *)&cmd,argv[1],(allocator *)&cin);
  file_in._M_dataplus._M_p = (pointer)&file_in.field_2;
  file_in._M_string_length = 0;
  file_out._M_dataplus._M_p = (pointer)&file_out.field_2;
  file_out._M_string_length = 0;
  file_in.field_2._M_local_buf[0] = '\0';
  file_out.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&cin,argv[2],(allocator *)&cout);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cin,
                          "-f");
  std::__cxx11::string::~string((string *)&cin);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&file_in);
    std::__cxx11::string::string((string *)&cin,argv[4],(allocator *)&cout);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cin,"-o");
    std::__cxx11::string::~string((string *)&cin);
    if (!bVar2) goto LAB_0010865b;
    std::__cxx11::string::assign((char *)&file_out);
    std::ifstream::ifstream(&cin);
    std::ofstream::ofstream(&cout);
    std::ifstream::open((string *)&cin,(_Ios_Openmode)&file_in);
    std::ofstream::open((string *)&cout,(_Ios_Openmode)&file_out);
    if ((abStack_408[*(long *)(_cin + -0x18)] & 5) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                     "Could not open file ",&file_in);
      std::runtime_error::runtime_error(prVar4,(string *)&h);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((abStack_200[*(long *)(_cout + -0x18)] & 5) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                     "Could not open file ",&file_out);
      std::runtime_error::runtime_error(prVar4,(string *)&h);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    HuffmanArchiver::HuffmanArchiver(&h);
    bVar2 = std::operator==(&cmd,"-c");
    if (bVar2) {
      HuffmanArchiver::zip(&h,(istream *)&cin,(ostream *)&cout);
LAB_001086ae:
      HuffmanArchiver::info((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_440,&h);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&info,&local_440);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_440);
      puVar1 = info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar5 = info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::ifstream::close();
      std::ofstream::close();
    }
    else {
      bVar2 = std::operator==(&cmd,"-u");
      if (bVar2) {
        HuffmanArchiver::unzip(&h,(istream *)&cin,(ostream *)&cout);
        goto LAB_001086ae;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Unknown command \'");
      poVar3 = std::operator<<(poVar3,(string *)&cmd);
      poVar3 = std::operator<<(poVar3,"\'!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::
    _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&h._data._M_h);
    std::ofstream::~ofstream(&cout);
    std::ifstream::~ifstream(&cin);
  }
  else {
LAB_0010865b:
    poVar3 = std::operator<<((ostream *)&std::cout,"Invalid arguments!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&file_out);
  std::__cxx11::string::~string((string *)&file_in);
  std::__cxx11::string::~string((string *)&cmd);
LAB_001087a2:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::vector<std::size_t> info;
    if (argc < 6) {
        std::cout << "Not enough arquments, need 6!" << std::endl;
        return 0;
    }

    bool f = false;
    std::string cmd = argv[1], file_in, file_out;
    if (std::string(argv[2]) == "-f") {
        file_in = argv[3];
        if (std::string(argv[4]) == "-o") {
            file_out = argv[5];
        } else {
            f = true;
        }
    } else {
        f = true;
    }

    if (f) {
        std::cout << "Invalid arguments!" << std::endl;
        return 0;
    }
    std::ifstream cin;
    std::ofstream cout;

    try {
        cin.open(file_in);
        cout.open(file_out);
        if (!cin) {
            throw std::runtime_error("Could not open file " + file_in);
        }
        if (!cout) {
            throw std::runtime_error("Could not open file " + file_out);
        }
    } catch (std::exception &e) {
        std::cout << e.what() << "!\n";
        return 0;
    }

    HuffmanArchiver h;
    if (cmd == "-c") {
        try {
            h.zip(cin, cout);
        } catch (HuffmanException &e) {
            std::cout << e.what() << std::endl;
            return 0;
        } catch (std::exception &e) {
            std::cout << "Standart exception: " << e.what() << std::endl;
            return 0;
        }
    } else if (cmd == "-u") {
        try {
            h.unzip(cin, cout);
        } catch (HuffmanException &e) {
            std::cout << e.what() << std::endl;
            return 0;
        } catch (std::exception &e) {
            std::cout << "Standart exception: " << e.what() << std::endl;
            return 0;
        }
    } else {
        std::cout << "Unknown command '"<< cmd << "'!" << std::endl;
        return 0;
    }

    info = h.info();
    for (auto n : info) {
        std::cout << n << std::endl;
    }
    cin.close();
    cout.close();
    return 0;
}